

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_bool jp2_read_ftyp_v2(opj_jp2_v2_t *jp2,uchar *p_header_data,uint p_header_size,
                         opj_event_mgr_t *p_manager)

{
  void *pvVar1;
  opj_event_mgr_t *in_RCX;
  uint in_EDX;
  OPJ_BYTE *in_RSI;
  long in_RDI;
  OPJ_UINT32 l_remaining_bytes;
  OPJ_UINT32 i;
  uint local_2c;
  OPJ_BYTE *local_18;
  opj_bool local_4;
  
  if (*(int *)(in_RDI + 100) == 1) {
    if (in_EDX < 8) {
      opj_event_msg_v2(in_RCX,1,"Error with FTYP signature Box size\n");
      local_4 = 0;
    }
    else {
      opj_read_bytes_LE(in_RSI,(OPJ_UINT32 *)(in_RDI + 0x44),4);
      opj_read_bytes_LE(in_RSI + 4,(OPJ_UINT32 *)(in_RDI + 0x48),4);
      local_18 = in_RSI + 8;
      if ((in_EDX - 8 & 3) == 0) {
        *(uint *)(in_RDI + 0x4c) = in_EDX - 8 >> 2;
        if (*(int *)(in_RDI + 0x4c) != 0) {
          pvVar1 = malloc((ulong)*(uint *)(in_RDI + 0x4c) << 2);
          *(void **)(in_RDI + 0x50) = pvVar1;
          if (*(long *)(in_RDI + 0x50) == 0) {
            opj_event_msg_v2(in_RCX,1,"Not enough memory with FTYP Box\n");
            return 0;
          }
          memset(*(void **)(in_RDI + 0x50),0,(ulong)*(uint *)(in_RDI + 0x4c) << 2);
        }
        for (local_2c = 0; local_2c < *(uint *)(in_RDI + 0x4c); local_2c = local_2c + 1) {
          opj_read_bytes_LE(local_18,(OPJ_UINT32 *)(*(long *)(in_RDI + 0x50) + (ulong)local_2c * 4),
                            4);
          local_18 = local_18 + 4;
        }
        *(uint *)(in_RDI + 100) = *(uint *)(in_RDI + 100) | 2;
        local_4 = 1;
      }
      else {
        opj_event_msg_v2(in_RCX,1,"Error with FTYP signature Box size\n");
        local_4 = 0;
      }
    }
  }
  else {
    opj_event_msg_v2(in_RCX,1,"The ftyp box must be the second box in the file.\n");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

opj_bool jp2_read_ftyp_v2(
							opj_jp2_v2_t *jp2,
							unsigned char * p_header_data,
							unsigned int p_header_size,
							opj_event_mgr_t * p_manager
						)
{
	OPJ_UINT32 i, l_remaining_bytes;

	/* preconditions */
	assert(p_header_data != 00);
	assert(jp2 != 00);
	assert(p_manager != 00);

	if (jp2->jp2_state != JP2_STATE_SIGNATURE) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "The ftyp box must be the second box in the file.\n");
		return OPJ_FALSE;
	}

	/* assure length of data is correct */
	if (p_header_size < 8) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with FTYP signature Box size\n");
		return OPJ_FALSE;
	}

	opj_read_bytes(p_header_data,&jp2->brand,4);		/* BR */
	p_header_data += 4;

	opj_read_bytes(p_header_data,&jp2->minversion,4);		/* MinV */
	p_header_data += 4;

	l_remaining_bytes = p_header_size - 8;

	/* the number of remaining bytes should be a multiple of 4 */
	if ((l_remaining_bytes & 0x3) != 0) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error with FTYP signature Box size\n");
		return OPJ_FALSE;
	}

	/* div by 4 */
	jp2->numcl = l_remaining_bytes >> 2;
	if (jp2->numcl) {
		jp2->cl = (unsigned int *) opj_malloc(jp2->numcl * sizeof(unsigned int));
		if (jp2->cl == 00) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Not enough memory with FTYP Box\n");
			return OPJ_FALSE;
		}
		memset(jp2->cl,0,jp2->numcl * sizeof(unsigned int));
	}

	for (i = 0; i < jp2->numcl; ++i)
	{
		opj_read_bytes(p_header_data,&jp2->cl[i],4);		/* CLi */
		p_header_data += 4;
	}

	jp2->jp2_state |= JP2_STATE_FILE_TYPE;

	return OPJ_TRUE;
}